

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O1

int Abc_NodeIsInv(Abc_Obj_t *pNode)

{
  Mio_Gate_t *pMVar1;
  uint uVar2;
  int iVar3;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar4;
  
  if (1 < pNode->pNtk->ntkType - ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x3d6,"int Abc_NodeIsInv(Abc_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x3d7,"int Abc_NodeIsInv(Abc_Obj_t *)");
  }
  uVar2 = 0;
  if ((pNode->vFanins).nSize == 1) {
    switch(pNode->pNtk->ntkFunc) {
    case ABC_FUNC_SOP:
      iVar3 = Abc_SopIsInv((char *)(pNode->field_5).pData);
      return iVar3;
    case ABC_FUNC_BDD:
    case ABC_FUNC_AIG:
      uVar2 = (pNode->field_5).iData & 1;
      break;
    case ABC_FUNC_MAP:
      pMVar1 = (Mio_Gate_t *)(pNode->field_5).pData;
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      pMVar4 = Mio_LibraryReadInv(pLib);
      uVar2 = (uint)(pMVar1 == pMVar4);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                    ,0x3e4,"int Abc_NodeIsInv(Abc_Obj_t *)");
    }
  }
  return uVar2;
}

Assistant:

int Abc_NodeIsInv( Abc_Obj_t * pNode )    
{ 
    Abc_Ntk_t * pNtk = pNode->pNtk;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    if ( Abc_ObjFaninNum(pNode) != 1 )
        return 0;
    if ( Abc_NtkHasSop(pNtk) )
        return Abc_SopIsInv((char *)pNode->pData);
#ifdef ABC_USE_CUDD
    if ( Abc_NtkHasBdd(pNtk) )
        return Cudd_IsComplement(pNode->pData);
#endif
    if ( Abc_NtkHasAig(pNtk) )
        return Hop_IsComplement((Hop_Obj_t *)pNode->pData)? 1:0;
    if ( Abc_NtkHasMapping(pNtk) )
        return pNode->pData == Mio_LibraryReadInv((Mio_Library_t *)Abc_FrameReadLibGen());
    assert( 0 );
    return 0;
}